

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

string * __thiscall CLI::App::get_display_name_abi_cxx11_(string *__return_storage_ptr__,App *this)

{
  ulong uVar1;
  string *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  App *local_18;
  App *this_local;
  
  local_18 = this;
  this_local = (App *)__return_storage_ptr__;
  uVar1 = ::std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->name_);
  }
  else {
    __rhs = get_group_abi_cxx11_(this);
    ::std::operator+(&local_38,"[Option Group: ",__rhs);
    ::std::operator+(__return_storage_ptr__,&local_38,"]");
    ::std::__cxx11::string::~string((string *)&local_38);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string get_display_name() const { return (!name_.empty()) ? name_ : "[Option Group: " + get_group() + "]"; }